

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O0

void __thiscall
squall::detail::KlassImp<Foo>::KlassImp(KlassImp<Foo> *this,HSQUIRRELVM vm,string *name)

{
  HSQOBJECT table;
  HSQOBJECT table_00;
  HSQUIRRELVM v;
  undefined1 local_40 [8];
  keeper k;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  string *name_local;
  HSQUIRRELVM vm_local;
  KlassImp<Foo> *this_local;
  
  KlassImpBase::KlassImpBase(&this->super_KlassImpBase);
  (this->super_KlassImpBase)._vptr_KlassImpBase = (_func_int **)&PTR__KlassImp_0015d308;
  this->vm_ = vm;
  v = (HSQUIRRELVM)&this->name_;
  std::__cxx11::string::string((string *)v,(string *)name);
  this->closed_ = false;
  make_getter_table(this);
  make_setter_table(this);
  keeper::keeper((keeper *)local_40,vm);
  sq_newclass(in_stack_ffffffffffffffd8,k.top);
  sq_getstackobj(v,(SQInteger)this,(HSQOBJECT *)0x1097ea);
  sq_addref(v,(HSQOBJECT *)this);
  table._0_8_ = *(ulong *)&this->getter_table_ & 0xffffffff;
  table._unVal.pTable = (this->getter_table_)._unVal.pTable;
  defmetamethod(this,"_get",table,delegate_get);
  table_00._0_8_ = *(ulong *)&this->setter_table_ & 0xffffffff;
  table_00._unVal.pTable = (this->setter_table_)._unVal.pTable;
  defmetamethod(this,"_set",table_00,delegate_set);
  keeper::~keeper((keeper *)local_40);
  return;
}

Assistant:

KlassImp(HSQUIRRELVM vm, const string& name)
        : vm_(vm), name_(name), closed_(false) {
        
        make_getter_table();
        make_setter_table();
        
        keeper k(vm);
        sq_newclass(vm, SQFalse);
        sq_getstackobj(vm, -1, &sqclass_);
        sq_addref(vm, &sqclass_);

        defmetamethod(_SC("_get"), getter_table_, delegate_get);
        defmetamethod(_SC("_set"), setter_table_, delegate_set);
    }